

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

bool __thiscall
booster::locale::impl_posix::ctype_posix<wchar_t>::do_is
          (ctype_posix<wchar_t> *this,mask m,wchar_t c)

{
  int iVar1;
  
  if (((m >> 0xd & 1) != 0) &&
     (iVar1 = iswspace_l(c,(__locale_t)
                           *(this->lc_).
                            super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ), iVar1 != 0)) {
    return true;
  }
  if (((m >> 0xe & 1) != 0) &&
     (iVar1 = iswprint_l(c,(__locale_t)
                           *(this->lc_).
                            super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ), iVar1 != 0)) {
    return true;
  }
  if (((m & 2) != 0) &&
     (iVar1 = iswcntrl_l(c,(__locale_t)
                           *(this->lc_).
                            super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ), iVar1 != 0)) {
    return true;
  }
  if (((m >> 8 & 1) != 0) &&
     (iVar1 = iswupper_l(c,(__locale_t)
                           *(this->lc_).
                            super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ), iVar1 != 0)) {
    return true;
  }
  if (((m >> 9 & 1) != 0) &&
     (iVar1 = iswlower_l(c,(__locale_t)
                           *(this->lc_).
                            super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ), iVar1 != 0)) {
    return true;
  }
  if (((m >> 10 & 1) != 0) &&
     (iVar1 = iswalpha_l(c,(__locale_t)
                           *(this->lc_).
                            super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ), iVar1 != 0)) {
    return true;
  }
  if (((m >> 0xb & 1) != 0) &&
     (iVar1 = iswdigit_l(c,(__locale_t)
                           *(this->lc_).
                            super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ), iVar1 != 0)) {
    return true;
  }
  if (((m >> 0xc & 1) != 0) &&
     (iVar1 = iswxdigit_l(c,(__locale_t)
                            *(this->lc_).
                             super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr), iVar1 != 0)) {
    return true;
  }
  if (((m & 4) != 0) &&
     (iVar1 = iswpunct_l(c,(__locale_t)
                           *(this->lc_).
                            super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ), iVar1 != 0)) {
    return true;
  }
  return false;
}

Assistant:

bool do_is(mask m,wchar_t c) const
    {
        if((m & space) && iswspace_l(c,*lc_))
            return true;
        if((m & print) && iswprint_l(c,*lc_))
            return true;
        if((m & cntrl) && iswcntrl_l(c,*lc_))
            return true;
        if((m & upper) && iswupper_l(c,*lc_))
            return true;
        if((m & lower) && iswlower_l(c,*lc_))
            return true;
        if((m & alpha) && iswalpha_l(c,*lc_))
            return true;
        if((m & digit) && iswdigit_l(c,*lc_))
            return true;
        if((m & xdigit) && iswxdigit_l(c,*lc_))
            return true;
        if((m & punct) && iswpunct_l(c,*lc_))
            return true;
        return false;
    }